

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O3

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  int *piVar17;
  int iVar18;
  void *pvVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  void *pvVar24;
  void *pvVar25;
  void *pvVar26;
  void *pvVar27;
  long lVar28;
  void *pvVar29;
  void *pvVar30;
  void *pvVar31;
  uint *puVar32;
  void *pvVar33;
  long lVar34;
  long lVar35;
  void *pvVar36;
  void *pvVar37;
  undefined4 uVar38;
  void *pvVar39;
  void *pvVar40;
  void *pvVar41;
  void *pvVar42;
  void *pvVar43;
  long lVar44;
  long lVar45;
  void *pvVar46;
  ulong uVar47;
  short tmp [6] [3];
  void *local_178;
  void *local_168;
  long local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  void *local_138;
  void *local_130;
  undefined1 local_a8 [64];
  size_t local_68;
  short asStack_5c [3];
  uint auStack_56 [9];
  
  local_68 = 0;
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_8_ = 0;
  local_a8._24_4_ = 0;
  local_a8._32_8_ = (Allocator *)0x0;
  local_a8._40_4_ = 0;
  local_a8._44_4_ = 0;
  local_a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_a8,0x24,inch,outch,2,(Allocator *)0x0);
  if (0 < outch) {
    pvVar43 = kernel->data;
    local_168 = (void *)local_a8._0_8_;
    local_178 = (void *)0x0;
    do {
      if (0 < inch) {
        iVar18 = inch * 9 * (int)local_178;
        uVar20 = 0;
        pvVar29 = local_168;
        do {
          lVar28 = uVar20 * 9;
          cVar1 = *(char *)((long)pvVar43 + lVar28 + iVar18);
          cVar2 = *(char *)((long)pvVar43 + lVar28 + (long)iVar18 + 1);
          cVar3 = *(char *)((long)pvVar43 + lVar28 + (long)iVar18 + 2);
          cVar4 = *(char *)((long)pvVar43 + lVar28 + (long)iVar18 + 3);
          cVar5 = *(char *)((long)pvVar43 + lVar28 + (long)iVar18 + 4);
          cVar6 = *(char *)((long)pvVar43 + lVar28 + (long)iVar18 + 5);
          cVar7 = *(char *)((long)pvVar43 + lVar28 + (long)iVar18 + 6);
          cVar8 = *(char *)((long)pvVar43 + lVar28 + (long)iVar18 + 7);
          cVar9 = *(char *)((long)pvVar43 + lVar28 + (long)iVar18 + 8);
          lVar28 = 4;
          do {
            sVar10 = *(short *)(&UNK_005185ec + lVar28);
            sVar11 = *(short *)(&UNK_005185ee + lVar28);
            sVar12 = *(short *)((long)&DAT_005185f0 + lVar28);
            *(short *)((long)asStack_5c + lVar28) = sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1
            ;
            *(short *)((long)asStack_5c + lVar28 + 2) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)auStack_56 + lVar28 + -2) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
            lVar28 = lVar28 + 6;
          } while (lVar28 != 0x28);
          lVar28 = 0;
          pvVar19 = pvVar29;
          do {
            sVar10 = *(short *)((long)auStack_56 + lVar28 * 6 + -2);
            uVar13 = *(uint *)((long)auStack_56 + lVar28 * 6);
            puVar32 = &DAT_005185f2;
            lVar34 = 0;
            do {
              auVar16 = vpmullw_avx(ZEXT416(*puVar32),ZEXT416(uVar13));
              uVar38 = vpextrw_avx(auVar16,1);
              *(short *)((long)pvVar19 + lVar34 * 2) =
                   (short)uVar38 + auVar16._0_2_ + *(short *)((long)puVar32 + -2) * sVar10;
              lVar34 = lVar34 + 1;
              puVar32 = (uint *)((long)puVar32 + 6);
            } while (lVar34 != 6);
            lVar28 = lVar28 + 1;
            pvVar19 = (void *)((long)pvVar19 + 0xc);
          } while (lVar28 != 6);
          uVar20 = uVar20 + 1;
          pvVar29 = (void *)((long)pvVar29 + (long)(int)local_a8._44_4_ * local_a8._16_8_);
        } while (uVar20 != (uint)inch);
      }
      local_178 = (void *)((long)local_178 + 1);
      local_168 = (void *)((long)local_168 + local_68 * local_a8._16_8_);
    } while (local_178 != (void *)(ulong)(uint)outch);
  }
  iVar18 = inch + 7;
  if (-1 < inch) {
    iVar18 = inch;
  }
  iVar23 = outch + 3;
  if (-1 < outch) {
    iVar23 = outch;
  }
  Mat::create(kernel_tm,iVar18 >> 3,0x24,iVar23 >> 2,0x40,0x20,(Allocator *)0x0);
  if (3 < outch) {
    lVar21 = (long)(int)local_a8._44_4_;
    lVar35 = local_a8._16_8_ * local_68;
    iVar18 = kernel_tm->w;
    pvVar19 = kernel_tm->data;
    sVar14 = kernel_tm->elemsize;
    sVar15 = kernel_tm->cstep;
    lVar44 = local_a8._16_8_ * lVar21;
    pvVar24 = (void *)((local_68 * 3 + lVar21) * local_a8._16_8_ + local_a8._0_8_);
    lVar28 = lVar35 * 4;
    lVar34 = lVar44 * 8;
    pvVar39 = (void *)((lVar21 + local_68 * 2) * local_a8._16_8_ + local_a8._0_8_);
    pvVar33 = (void *)((local_68 + lVar21) * local_a8._16_8_ + local_a8._0_8_);
    pvVar43 = (void *)(local_a8._0_8_ + lVar44);
    pvVar30 = (void *)(lVar35 * 3 + local_a8._0_8_);
    pvVar29 = (void *)(local_a8._0_8_ + lVar35 * 2);
    pvVar36 = (void *)(lVar35 + local_a8._0_8_);
    uVar20 = 0;
    pvVar27 = (void *)local_a8._0_8_;
    do {
      local_160 = 0;
      local_178 = pvVar43;
      local_168 = pvVar33;
      local_158 = pvVar24;
      local_150 = pvVar39;
      local_148 = pvVar30;
      local_140 = pvVar29;
      local_138 = pvVar36;
      local_130 = pvVar27;
      do {
        if (7 < inch) {
          lVar35 = (long)pvVar19 +
                   (long)iVar18 * sVar14 * local_160 + (uVar20 >> 2) * sVar15 * sVar14;
          pvVar25 = local_138;
          pvVar26 = local_130;
          lVar21 = 0;
          pvVar31 = local_178;
          pvVar37 = local_148;
          pvVar40 = local_140;
          pvVar41 = local_150;
          pvVar42 = local_168;
          pvVar46 = local_158;
          do {
            lVar22 = 0;
            lVar45 = 0;
            do {
              *(undefined2 *)(lVar35 + lVar45) = *(undefined2 *)((long)pvVar26 + lVar22);
              *(undefined2 *)(lVar35 + lVar45 + 2) = *(undefined2 *)((long)pvVar31 + lVar22);
              *(undefined2 *)(lVar35 + lVar45 + 4) = *(undefined2 *)((long)pvVar25 + lVar22);
              *(undefined2 *)(lVar35 + lVar45 + 6) = *(undefined2 *)((long)pvVar42 + lVar22);
              *(undefined2 *)(lVar35 + lVar45 + 8) = *(undefined2 *)((long)pvVar40 + lVar22);
              *(undefined2 *)(lVar35 + lVar45 + 10) = *(undefined2 *)((long)pvVar41 + lVar22);
              *(undefined2 *)(lVar35 + lVar45 + 0xc) = *(undefined2 *)((long)pvVar37 + lVar22);
              *(undefined2 *)(lVar35 + lVar45 + 0xe) = *(undefined2 *)((long)pvVar46 + lVar22);
              lVar45 = lVar45 + 0x10;
              lVar22 = lVar22 + lVar44 * 2;
            } while (lVar45 != 0x40);
            lVar22 = lVar21 + 0xf;
            pvVar46 = (void *)((long)pvVar46 + lVar34);
            pvVar41 = (void *)((long)pvVar41 + lVar34);
            pvVar42 = (void *)((long)pvVar42 + lVar34);
            pvVar31 = (void *)((long)pvVar31 + lVar34);
            pvVar37 = (void *)((long)pvVar37 + lVar34);
            pvVar40 = (void *)((long)pvVar40 + lVar34);
            pvVar25 = (void *)((long)pvVar25 + lVar34);
            pvVar26 = (void *)((long)pvVar26 + lVar34);
            lVar35 = lVar35 + 0x40;
            lVar21 = lVar21 + 8;
          } while (lVar22 < inch);
        }
        local_160 = local_160 + 1;
        local_158 = (void *)((long)local_158 + 2);
        local_150 = (void *)((long)local_150 + 2);
        local_168 = (void *)((long)local_168 + 2);
        local_178 = (void *)((long)local_178 + 2);
        local_148 = (void *)((long)local_148 + 2);
        local_140 = (void *)((long)local_140 + 2);
        local_138 = (void *)((long)local_138 + 2);
        local_130 = (void *)((long)local_130 + 2);
      } while (local_160 != 0x24);
      uVar47 = uVar20 + 7;
      pvVar24 = (void *)((long)pvVar24 + lVar28);
      pvVar39 = (void *)((long)pvVar39 + lVar28);
      pvVar33 = (void *)((long)pvVar33 + lVar28);
      pvVar43 = (void *)((long)pvVar43 + lVar28);
      pvVar30 = (void *)((long)pvVar30 + lVar28);
      pvVar29 = (void *)((long)pvVar29 + lVar28);
      pvVar36 = (void *)((long)pvVar36 + lVar28);
      pvVar27 = (void *)((long)pvVar27 + lVar28);
      uVar20 = uVar20 + 4;
    } while (uVar47 < (uint)outch);
  }
  piVar17 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_a8._0_8_ != (void *)0x0) {
          free((void *)local_a8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_a8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(kernel, kernel_tm, inch, outch, opt);
}